

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase193::run(TestCase193 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  ListElementCount LVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  size_t __n;
  ElementCount index;
  Reader RVar8;
  Reader RVar9;
  StructSchema schema;
  Builder field;
  PointerBuilder local_248;
  Builder type;
  Builder root;
  int iStack_1d0;
  Builder fields;
  Schema local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  SchemaLoader loader;
  DebugComparison<kj::String,_kj::String> _kjCondition;
  
  _kjCondition.left.content.size_ = (size_t)_kjCondition.left.content.ptr;
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadNative(&loader,(RawSchema *)schemas::s_95b30dd14e01dda8);
  local_168 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_160 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  _kjCondition.left.content.ptr =
       (char *)SchemaLoader::get(&loader,0x95b30dd14e01dda8,brand,(Schema)0x6ff7f8);
  schema = Schema::asStruct((Schema *)&_kjCondition);
  local_190.raw = (RawBrandedSchema *)(schemas::s_95b30dd14e01dda8 + 0x48);
  Schema::getProto((Reader *)&fields,&local_190);
  kj::str<capnp::schema::Node::Reader>((String *)&type,(Reader *)&fields);
  field._builder.segment = type._builder.segment;
  field._builder.capTable = type._builder.capTable;
  field._builder.data = type._builder.data;
  type._builder._0_16_ = ZEXT816(0);
  Schema::getProto((Reader *)&root,&schema.super_Schema);
  kj::str<capnp::schema::Node::Reader>((String *)&local_248,(Reader *)&root);
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&field,(String *)&local_248);
  pSVar2 = local_248.segment;
  if (local_248.segment != (SegmentBuilder *)0x0) {
    pCVar3 = local_248.capTable;
    local_248._0_16_ = ZEXT816(0);
    (**(code **)*local_248.pointer)(local_248.pointer,pSVar2,1,pCVar3,pCVar3,0);
  }
  pCVar3 = field._builder.capTable;
  pSVar2 = field._builder.segment;
  if (field._builder.segment != (SegmentBuilder *)0x0) {
    field._builder.segment = (SegmentBuilder *)0x0;
    field._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**field._builder.data)(field._builder.data,pSVar2,1,pCVar3,pCVar3,0);
  }
  pSVar2 = type._builder.segment;
  if (type._builder.segment != (SegmentBuilder *)0x0) {
    pCVar3 = type._builder.capTable;
    type._builder._0_16_ = ZEXT816(0);
    (*(code *)**type._builder.data)(type._builder.data,pSVar2,1,pCVar3,pCVar3,0);
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_248.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
    Schema::getProto((Reader *)&fields,(Schema *)&local_248);
    kj::str<capnp::schema::Node::Reader>((String *)&field,(Reader *)&fields);
    Schema::getProto((Reader *)&root,&schema.super_Schema);
    kj::str<capnp::schema::Node::Reader>((String *)&type,(Reader *)&root);
    kj::_::Debug::
    log<char_const(&)[108],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"(kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))\", _kjCondition, kj::str(Schema::from<test::TestOldVersion>().getProto()), kj::str(schema.getProto())"
               ,(char (*) [108])
                "failed: expected (kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))"
               ,&_kjCondition,(String *)&field,(String *)&type);
    pSVar2 = type._builder.segment;
    if (type._builder.segment != (SegmentBuilder *)0x0) {
      pCVar3 = type._builder.capTable;
      type._builder._0_16_ = ZEXT816(0);
      (*(code *)**type._builder.data)(type._builder.data,pSVar2,1,pCVar3,pCVar3,0);
    }
    pCVar3 = field._builder.capTable;
    pSVar2 = field._builder.segment;
    if (field._builder.segment != (SegmentBuilder *)0x0) {
      field._builder.segment = (SegmentBuilder *)0x0;
      field._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)**field._builder.data)(field._builder.data,pSVar2,1,pCVar3,pCVar3,0);
    }
  }
  sVar6 = _kjCondition.right.content.size_;
  pcVar5 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  pcVar5 = _kjCondition.left.content.ptr;
  if (_kjCondition.left.content.ptr != (char *)0x0) {
    sVar6 = _kjCondition.left.content.size_;
    _kjCondition.left.content._0_16_ = ZEXT816(0);
    (**(_kjCondition.left.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.left.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  local_248.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&root,(Schema *)&local_248);
  MessageBuilder::getRootInternal((Builder *)&type,(MessageBuilder *)&_kjCondition);
  fields.builder.step = root._builder.pointers._4_4_;
  fields.builder.elementCount = (ListElementCount)root._builder.pointers;
  fields.builder._32_8_ = (ulong)root._builder.pointerCount << 0x20;
  fields.builder.ptr = (byte *)root._builder.data;
  fields.builder.segment = root._builder.segment;
  fields.builder.capTable = root._builder.capTable;
  field._builder.data = type._builder.data;
  field._builder.segment = type._builder.segment;
  field._builder.capTable = type._builder.capTable;
  PointerBuilder::setStruct((PointerBuilder *)&field,(StructReader *)&fields,false);
  MessageBuilder::getRootInternal((Builder *)&field,(MessageBuilder *)&_kjCondition);
  fields.builder.ptr = (byte *)field._builder.data;
  fields.builder.segment = field._builder.segment;
  fields.builder.capTable = field._builder.capTable;
  PointerBuilder::getStruct
            (&root._builder,(PointerBuilder *)&fields,(StructSize)0x60006,(word *)0x0);
  *(undefined8 *)root._builder.data = 0x95b30dd14e01dda8;
  if (*(short *)((long)root._builder.data + 0xc) == 1) {
    field._builder.data =
         (void *)(CONCAT44(root._builder.pointers._4_4_,(ListElementCount)root._builder.pointers) +
                 0x18);
    field._builder.segment = root._builder.segment;
    field._builder.capTable = root._builder.capTable;
    PointerBuilder::getStructList
              (&fields.builder,(PointerBuilder *)&field,(StructSize)0x40003,(word *)0x0);
    LVar4 = fields.builder.elementCount;
    if (fields.builder.elementCount != 0) {
      index = 0;
      do {
        ListBuilder::getStructElement(&field._builder,&fields.builder,index);
        if (*(short *)((long)field._builder.data + 8) == 0) {
          local_248.pointer =
               (WirePointer *)
               (CONCAT44(field._builder.pointers._4_4_,(int)field._builder.pointers) + 0x10);
          local_248.capTable = field._builder.capTable;
          local_248.segment = field._builder.segment;
          PointerBuilder::getStruct(&type._builder,&local_248,(StructSize)0x10003,(word *)0x0);
          if ((*type._builder.data == 0x10) &&
             (*(long *)((long)type._builder.data + 8) == -0x7128a58b960fb31d)) {
            *(undefined8 *)((long)type._builder.data + 8) = 0x95b30dd14e01dda8;
          }
        }
        index = index + 1;
      } while (LVar4 != index);
    }
  }
  StructBuilder::asReader(&root._builder);
  SchemaLoader::load(&loader,(Reader *)&fields);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  type._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&type);
  root._builder.capTable = fields.builder.capTable;
  root._builder.data = (void *)fields.builder._24_8_;
  root._builder.segment = fields.builder.segment;
  root._builder.pointers._0_4_ = iStack_1d0;
  if (fields.builder.structPointerCount == 0) {
    root._builder.capTable = (CapTableBuilder *)0x0;
    root._builder.data = (void *)0x0;
    root._builder.segment = (SegmentBuilder *)0x0;
    root._builder.pointers._0_4_ = 0x7fffffff;
  }
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)&root,(void *)0x0,0);
  __n = RVar8.super_StringPtr.content.size_;
  Schema::getProto((Reader *)&root,&schema.super_Schema);
  if (root._builder.pointerCount == 0) {
    field._builder.pointers._0_4_ = 0x7fffffff;
    field._builder.capTable = (CapTableBuilder *)0x0;
    field._builder.data = (void *)0x0;
    field._builder.segment = (SegmentBuilder *)0x0;
  }
  else {
    field._builder.data =
         (void *)CONCAT44(root._builder.pointers._4_4_,(ListElementCount)root._builder.pointers);
    field._builder.capTable = root._builder.capTable;
    field._builder.segment = root._builder.segment;
    field._builder.pointers._0_4_ = iStack_1d0;
  }
  RVar9 = PointerReader::getBlob<capnp::Text>((PointerReader *)&field,(void *)0x0,0);
  if (__n == RVar9.super_StringPtr.content.size_) {
    if (__n == 0) {
      _kjCondition.op.content.ptr._0_1_ = true;
    }
    else {
      iVar7 = bcmp(RVar8.super_StringPtr.content.ptr,RVar9.super_StringPtr.content.ptr,__n);
      _kjCondition.op.content.ptr._0_1_ = iVar7 == 0;
    }
  }
  else {
    _kjCondition.op.content.ptr._0_1_ = false;
  }
  _kjCondition.right.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.right.content.disposer = (ArrayDisposer *)&DAT_00000005;
  _kjCondition.left.content._0_16_ = RVar8;
  _kjCondition._16_16_ = RVar9;
  if (((bool)(char)_kjCondition.op.content.ptr == false) && (kj::_::Debug::minSeverity < 3)) {
    local_190.raw = (RawBrandedSchema *)(schemas::s_8ed75a7469f04ce3 + 0x48);
    Schema::getProto((Reader *)&fields,&local_190);
    root._builder.capTable = fields.builder.capTable;
    root._builder.segment = fields.builder.segment;
    root._builder.pointers._0_4_ = iStack_1d0;
    if (fields.builder.structPointerCount == 0) {
      fields.builder._24_8_ = (void *)0x0;
      root._builder.capTable = (CapTableBuilder *)0x0;
      root._builder.segment = (SegmentBuilder *)0x0;
      root._builder.pointers._0_4_ = 0x7fffffff;
    }
    root._builder.data = (void *)fields.builder._24_8_;
    type._builder._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)&root,(void *)0x0,0)
    ;
    Schema::getProto((Reader *)&root,&schema.super_Schema);
    if (root._builder.pointerCount == 0) {
      iStack_1d0 = 0x7fffffff;
      field._builder.capTable = (CapTableBuilder *)0x0;
      field._builder.data = (void *)0x0;
      field._builder.segment = (SegmentBuilder *)0x0;
    }
    else {
      field._builder.data =
           (void *)CONCAT44(root._builder.pointers._4_4_,(ListElementCount)root._builder.pointers);
      field._builder.capTable = root._builder.capTable;
      field._builder.segment = root._builder.segment;
    }
    field._builder.pointers._0_4_ = iStack_1d0;
    local_248._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)&field,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[124],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", _kjCondition, Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
               ,(char (*) [124])
                "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)&_kjCondition,
               (Reader *)&type,(Reader *)&local_248);
  }
  Schema::requireUsableAs(&schema.super_Schema,(RawSchema *)schemas::s_95b30dd14e01dda8);
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Upgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestOldVersion>();

  StructSchema schema = loader.get(typeId<test::TestOldVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestOldVersion>().getProto()),
            kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestNewVersion>(loader, typeId<test::TestOldVersion>());

  // The new version replaced the old.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());

  // But it is still usable as the old version.
  schema.requireUsableAs<test::TestOldVersion>();
}